

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

int __thiscall EmmyFacade::OnDisconnect(EmmyFacade *this)

{
  EmmyDebuggerManager *this_00;
  
  this->isIDEReady = false;
  this->isWaitingForIDE = false;
  this_00 = &this->_emmyDebuggerManager;
  EmmyDebuggerManager::OnDisconnect(this_00);
  EmmyDebuggerManager::RemoveAllBreakpoints(this_00);
  if (this->workMode == Attach) {
    EmmyDebuggerManager::RemoveAllDebugger(this_00);
  }
  return 0;
}

Assistant:

int EmmyFacade::OnDisconnect() {
	isIDEReady = false;
	isWaitingForIDE = false;

	_emmyDebuggerManager.OnDisconnect();

	_emmyDebuggerManager.RemoveAllBreakpoints();

	if (workMode == WorkMode::Attach) {
		_emmyDebuggerManager.RemoveAllDebugger();
	}

	return 0;
}